

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

string * __thiscall
toml::detail::region::line_abi_cxx11_(string *__return_storage_ptr__,region *this)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator first;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  char local_39;
  char *local_38;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  char *local_28;
  detail *local_20;
  region *local_18;
  region *this_local;
  
  local_18 = this;
  this_local = (region *)__return_storage_ptr__;
  bVar1 = contain_newline(this);
  if (bVar1) {
    local_20 = (detail *)line_begin(this);
    local_30._M_current = (char *)line_begin(this);
    local_38 = (char *)last(this);
    local_39 = '\n';
    local_28 = (char *)std::
                       find<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char>
                                 (local_30,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                            )local_38,&local_39);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (__return_storage_ptr__,local_20,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)local_28,
               in_RCX);
  }
  else {
    this_00 = line_begin(this);
    first = line_end(this);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (__return_storage_ptr__,(detail *)this_00._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               first._M_current,in_RCX);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string line() const override
    {
        if(this->contain_newline())
        {
            return make_string(this->line_begin(),
                    std::find(this->line_begin(), this->last(), '\n'));
        }
        return make_string(this->line_begin(), this->line_end());
    }